

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sector.cpp
# Opt level: O2

void __thiscall Sector::set_baddatacrc(Sector *this,bool bad)

{
  vector<Data,_std::allocator<Data>_> *this_00;
  vector<unsigned_char,std::allocator<unsigned_char>> *this_01;
  int iVar1;
  int iVar2;
  undefined7 in_register_00000031;
  uint8_t fill_byte;
  allocator_type local_31;
  Data pad;
  
  this->m_bad_data_crc = bad;
  if ((int)CONCAT71(in_register_00000031,bad) != 0) {
    return;
  }
  iVar1 = 0;
  if (0 < opt.fill) {
    iVar1 = opt.fill;
  }
  fill_byte = (uint8_t)iVar1;
  this_00 = &this->m_data;
  iVar1 = (int)(((long)(this->m_data).super__Vector_base<Data,_std::allocator<Data>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                (long)(this->m_data).super__Vector_base<Data,_std::allocator<Data>_>._M_impl.
                      super__Vector_impl_data._M_start) / 0x18);
  if (iVar1 == 0) {
    iVar1 = Header::sector_size(&this->header);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              (&pad.super_vector<unsigned_char,_std::allocator<unsigned_char>_>,(long)iVar1,
               &fill_byte,&local_31);
    std::vector<Data,_std::allocator<Data>_>::emplace_back<Data>(this_00,&pad);
  }
  else {
    if (iVar1 < 2) {
      return;
    }
    std::vector<Data,_std::allocator<Data>_>::resize(this_00,1);
    iVar1 = data_size(this);
    iVar2 = Header::sector_size(&this->header);
    if (iVar2 <= iVar1) {
      return;
    }
    iVar1 = Header::sector_size(&this->header);
    iVar2 = data_size(this);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              (&pad.super_vector<unsigned_char,_std::allocator<unsigned_char>_>,
               (long)(iVar1 - iVar2),&fill_byte,&local_31);
    this_01 = (vector<unsigned_char,std::allocator<unsigned_char>> *)
              (this_00->super__Vector_base<Data,_std::allocator<Data>_>)._M_impl.
              super__Vector_impl_data._M_start;
    std::vector<unsigned_char,std::allocator<unsigned_char>>::
    insert<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,void>
              (this_01,(const_iterator)*(uchar **)this_01,
               (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                )pad.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_start,
               (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                )pad.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_finish);
  }
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&pad);
  return;
}

Assistant:

void Sector::set_baddatacrc(bool bad)
{
    m_bad_data_crc = bad;

    if (!bad)
    {
        auto fill_byte = static_cast<uint8_t>((opt.fill >= 0) ? opt.fill : 0);

        if (!has_data())
            m_data.push_back(Data(size(), fill_byte));
        else if (copies() > 1)
        {
            m_data.resize(1);

            if (data_size() < size())
            {
                auto pad{ Data(size() - data_size(), fill_byte) };
                m_data[0].insert(m_data[0].begin(), pad.begin(), pad.end());
            }
        }
    }
}